

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_impl.cpp
# Opt level: O0

MPP_RET enc_impl_deinit(EncImpl impl)

{
  EncImplCtx *p;
  EncImpl impl_local;
  
  if (impl == (EncImpl)0x0) {
    _mpp_log_l(2,"enc_impl","found NULL input\n","enc_impl_deinit");
    impl_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    if (*(long *)(*(long *)((long)impl + 0x18) + 0x20) != 0) {
      (**(code **)(*(long *)((long)impl + 0x18) + 0x20))(*(undefined8 *)((long)impl + 0x20));
    }
    mpp_osal_free("enc_impl_deinit",*(void **)((long)impl + 0x20));
    mpp_osal_free("enc_impl_deinit",impl);
    impl_local._4_4_ = MPP_OK;
  }
  return impl_local._4_4_;
}

Assistant:

MPP_RET enc_impl_deinit(EncImpl impl)
{
    if (NULL == impl) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    EncImplCtx *p = (EncImplCtx *)impl;
    if (p->api->deinit)
        p->api->deinit(p->ctx);

    mpp_free(p->ctx);
    mpp_free(p);
    return MPP_OK;
}